

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_tests.cpp
# Opt level: O0

void __thiscall skiwi::anon_unknown_23::read_numerics::test(read_numerics *this)

{
  allocator<char> local_331;
  string local_330;
  string local_310;
  allocator<char> local_2e9;
  string local_2e8;
  string local_2c8;
  allocator<char> local_2a1;
  string local_2a0;
  string local_280;
  allocator<char> local_259;
  string local_258;
  string local_238;
  allocator<char> local_211;
  string local_210;
  string local_1f0;
  allocator<char> local_1c9;
  string local_1c8;
  string local_1a8;
  allocator<char> local_181;
  string local_180;
  string local_160;
  allocator<char> local_139;
  string local_138;
  string local_118;
  allocator<char> local_f1;
  string local_f0;
  string local_d0;
  allocator<char> local_a9;
  string local_a8;
  string local_88;
  allocator<char> local_51;
  string local_50;
  string local_30;
  read_numerics *local_10;
  read_numerics *this_local;
  
  local_10 = this;
  compile_fixture_skiwi::build_srfi6((compile_fixture_skiwi *)this);
  compile_fixture_skiwi::build_csv((compile_fixture_skiwi *)this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"(string->number \"-8.9787310571409761906e-05\")",&local_51);
  compile_fixture_skiwi::run(&local_30,(compile_fixture_skiwi *)this,&local_50);
  TestEq<char_const*,std::__cxx11::string>
            ("-8.97873e-05",&local_30,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x1438,"void skiwi::(anonymous namespace)::read_numerics::test()");
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,
             "(define p (open-input-string \"(0.98718667030334472656 -8.9787310571409761906e-05 0.37939864397048950195)\"))"
             ,&local_a9);
  compile_fixture_skiwi::run(&local_88,(compile_fixture_skiwi *)this,&local_a8);
  TestEq<char_const*,std::__cxx11::string>
            ("<port>: \"input-string\"",&local_88,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x143a,"void skiwi::(anonymous namespace)::read_numerics::test()");
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"(read p)",&local_f1);
  compile_fixture_skiwi::run(&local_d0,(compile_fixture_skiwi *)this,&local_f0);
  TestEq<char_const*,std::__cxx11::string>
            ("(0.987187 -8.97873e-05 0.379399)",&local_d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x143b,"void skiwi::(anonymous namespace)::read_numerics::test()");
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator(&local_f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"(define p (open-input-string \"1,2,3\"))",&local_139);
  compile_fixture_skiwi::run(&local_118,(compile_fixture_skiwi *)this,&local_138);
  TestEq<char_const*,std::__cxx11::string>
            ("<port>: \"input-string\"",&local_118,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x143d,"void skiwi::(anonymous namespace)::read_numerics::test()");
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator(&local_139);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,"(read-line p)",&local_181);
  compile_fixture_skiwi::run(&local_160,(compile_fixture_skiwi *)this,&local_180);
  TestEq<char_const*,std::__cxx11::string>
            ("\"1,2,3\"",&local_160,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x143e,"void skiwi::(anonymous namespace)::read_numerics::test()");
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator(&local_181);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c8,"(define p (open-input-string \"1,2,3\"))",&local_1c9);
  compile_fixture_skiwi::run(&local_1a8,(compile_fixture_skiwi *)this,&local_1c8);
  TestEq<char_const*,std::__cxx11::string>
            ("<port>: \"input-string\"",&local_1a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x1440,"void skiwi::(anonymous namespace)::read_numerics::test()");
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator(&local_1c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_210,"(parse-line (open-input-string (read-line p)))",&local_211);
  compile_fixture_skiwi::run(&local_1f0,(compile_fixture_skiwi *)this,&local_210);
  TestEq<char_const*,std::__cxx11::string>
            ("(\"1\" \"2\" \"3\")",&local_1f0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x1441,"void skiwi::(anonymous namespace)::read_numerics::test()");
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  std::allocator<char>::~allocator(&local_211);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,
             "(define p (open-input-string \"-64.329442,52.656052,-48.669564\"))",&local_259);
  compile_fixture_skiwi::run(&local_238,(compile_fixture_skiwi *)this,&local_258);
  TestEq<char_const*,std::__cxx11::string>
            ("<port>: \"input-string\"",&local_238,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x1443,"void skiwi::(anonymous namespace)::read_numerics::test()");
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator(&local_259);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"(read-line p)",&local_2a1);
  compile_fixture_skiwi::run(&local_280,(compile_fixture_skiwi *)this,&local_2a0);
  TestEq<char_const*,std::__cxx11::string>
            ("\"-64.329442,52.656052,-48.669564\"",&local_280,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x1444,"void skiwi::(anonymous namespace)::read_numerics::test()");
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::allocator<char>::~allocator(&local_2a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e8,
             "(define p (open-input-string \"-64.329442,52.656052,-48.669564\"))",&local_2e9);
  compile_fixture_skiwi::run(&local_2c8,(compile_fixture_skiwi *)this,&local_2e8);
  TestEq<char_const*,std::__cxx11::string>
            ("<port>: \"input-string\"",&local_2c8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x1446,"void skiwi::(anonymous namespace)::read_numerics::test()");
  std::__cxx11::string::~string((string *)&local_2c8);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::allocator<char>::~allocator(&local_2e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_330,"(parse-line (open-input-string (read-line p)))",&local_331);
  compile_fixture_skiwi::run(&local_310,(compile_fixture_skiwi *)this,&local_330);
  TestEq<char_const*,std::__cxx11::string>
            ("(\"-64.329442\" \"52.656052\" \"-48.669564\")",&local_310,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0x1447,"void skiwi::(anonymous namespace)::read_numerics::test()");
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string((string *)&local_330);
  std::allocator<char>::~allocator(&local_331);
  return;
}

Assistant:

void test()
      {
      build_srfi6();
      build_csv();
      TEST_EQ("-8.97873e-05", run("(string->number \"-8.9787310571409761906e-05\")"));

      TEST_EQ("<port>: \"input-string\"", run("(define p (open-input-string \"(0.98718667030334472656 -8.9787310571409761906e-05 0.37939864397048950195)\"))"));
      TEST_EQ("(0.987187 -8.97873e-05 0.379399)", run("(read p)"));

      TEST_EQ("<port>: \"input-string\"", run("(define p (open-input-string \"1,2,3\"))"));
      TEST_EQ("\"1,2,3\"", run("(read-line p)"));

      TEST_EQ("<port>: \"input-string\"", run("(define p (open-input-string \"1,2,3\"))"));
      TEST_EQ("(\"1\" \"2\" \"3\")", run("(parse-line (open-input-string (read-line p)))"));

      TEST_EQ("<port>: \"input-string\"", run("(define p (open-input-string \"-64.329442,52.656052,-48.669564\"))"));
      TEST_EQ("\"-64.329442,52.656052,-48.669564\"", run("(read-line p)"));

      TEST_EQ("<port>: \"input-string\"", run("(define p (open-input-string \"-64.329442,52.656052,-48.669564\"))"));
      TEST_EQ("(\"-64.329442\" \"52.656052\" \"-48.669564\")", run("(parse-line (open-input-string (read-line p)))"));

      //TEST_EQ("1", run("(read p)"));
      //TEST_EQ(",", run("(%read-identifier (read-char p) p)"));
      //TEST_EQ("2", run("(read p)"));
      //TEST_EQ(",", run("(read p)"));
      //TEST_EQ("3", run("(read p)"));      

      //TEST_EQ("<port>: \"input-string\"", run("(define p (open-input-string \"-64.329442,52.656052,-48.669564\"))"));
      //TEST_EQ("-64.3294", run("(read p)"));
      //TEST_EQ(",", run("(read p)"));
      }